

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

void __thiscall QRenderRule::fixupBorder(QRenderRule *this,int nativeWidth)

{
  QSharedDataPointer<QStyleSheetBorderData> *this_00;
  int iVar1;
  undefined8 uVar2;
  char cVar3;
  QStyleSheetBorderData *pQVar4;
  QStyleSheetBorderImageData *pQVar5;
  int i;
  long lVar6;
  QStyleSheetPaletteData *pQVar7;
  byte bVar8;
  long lVar9;
  QSharedDataPointer<QStyleSheetPaletteData> *this_01;
  long in_FS_OFFSET;
  QBrush color;
  undefined8 local_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = (this->bd).d.ptr;
  if (pQVar4 == (QStyleSheetBorderData *)0x0) goto LAB_00354a53;
  this_00 = &this->bd;
  if ((__int_type)
      (pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> != 1) {
    QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_00);
    pQVar4 = (this_00->d).ptr;
  }
  if ((pQVar4->bi).d.ptr != (QStyleSheetBorderImageData *)0x0) {
    if ((pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i != 1) {
      QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_00);
      pQVar4 = (this_00->d).ptr;
    }
    if ((__int_type)
        (((pQVar4->bi).d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> != 1) {
      QSharedDataPointer<QStyleSheetBorderImageData>::detach_helper(&pQVar4->bi);
    }
    cVar3 = QPixmap::isNull();
    pQVar4 = (this_00->d).ptr;
    if (cVar3 == '\0') {
      if (pQVar4 == (QStyleSheetBorderData *)0x0) {
        pQVar4 = (QStyleSheetBorderData *)0x0;
      }
      else if ((__int_type)
               (pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.
               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> != 1) {
        QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_00);
        pQVar4 = (this_00->d).ptr;
      }
      pQVar5 = (pQVar4->bi).d.ptr;
      if ((__int_type)
          (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1) {
        QSharedDataPointer<QStyleSheetBorderImageData>::detach_helper(&pQVar4->bi);
        pQVar5 = (pQVar4->bi).d.ptr;
      }
      if (pQVar5->cuts[0] == -1) {
        pQVar4 = (this_00->d).ptr;
        lVar6 = 0;
        do {
          pQVar5->cuts[lVar6] = pQVar4->borders[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 4);
      }
      goto LAB_00354a53;
    }
  }
  if ((pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i != 1) {
    QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_00);
    pQVar4 = (this_00->d).ptr;
  }
  QSharedDataPointer<QStyleSheetBorderImageData>::reset
            (&pQVar4->bi,(QStyleSheetBorderImageData *)0x0);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar7 = (this->pal).d.ptr;
  if (pQVar7 == (QStyleSheetPaletteData *)0x0) {
LAB_00354839:
    QBrush::QBrush((QBrush *)&local_40);
  }
  else {
    this_01 = &this->pal;
    if ((__int_type)
        (pQVar7->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> != 1) {
      QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
      pQVar7 = (this_01->d).ptr;
      if (pQVar7 == (QStyleSheetPaletteData *)0x0) goto LAB_00354839;
    }
    if ((pQVar7->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i != 1) {
      QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
      pQVar7 = (this_01->d).ptr;
    }
    QBrush::QBrush((QBrush *)&local_40,&pQVar7->foreground);
  }
  pQVar4 = (this_00->d).ptr;
  if ((__int_type)
      (pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> != 1) {
    QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_00);
    pQVar4 = (this_00->d).ptr;
  }
  if ((pQVar4->radii[0].wd.m_i < 0) || (pQVar4->radii[0].ht.m_i < 0)) {
    if ((pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i != 1) {
      QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_00);
      pQVar4 = (this_00->d).ptr;
    }
    if ((-1 < pQVar4->radii[1].wd.m_i) && (-1 < pQVar4->radii[1].ht.m_i)) goto LAB_003548a8;
    if ((pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i != 1) {
      QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_00);
      pQVar4 = (this_00->d).ptr;
    }
    if ((-1 < pQVar4->radii[2].wd.m_i) && (-1 < pQVar4->radii[2].ht.m_i)) goto LAB_003548a8;
    if ((pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i != 1) {
      QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_00);
      pQVar4 = (this_00->d).ptr;
    }
    bVar8 = (byte)((byte)((uint)pQVar4->radii[3].ht.m_i >> 0x18) |
                  (byte)((uint)pQVar4->radii[3].wd.m_i >> 0x18)) >> 7;
  }
  else {
LAB_003548a8:
    bVar8 = 0;
  }
  lVar9 = 0x18;
  lVar6 = 0;
  do {
    pQVar4 = (this_00->d).ptr;
    if ((__int_type)
        (pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> != 1) {
      QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_00);
      pQVar4 = (this_00->d).ptr;
    }
    if (*(int *)((long)pQVar4->styles + lVar6) == 0xc && bVar8 == 0) {
      if ((pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i != 1) {
        QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_00);
        pQVar4 = (this_00->d).ptr;
      }
      *(undefined4 *)((long)pQVar4->styles + lVar6) = 1;
    }
    if ((pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i != 1) {
      QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_00);
      pQVar4 = (this_00->d).ptr;
    }
    iVar1 = *(int *)((long)pQVar4->styles + lVar6);
    if (iVar1 == 0xc) {
      if ((pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i != 1) {
        QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_00);
        pQVar4 = (this_00->d).ptr;
      }
      if (*(int *)((long)pQVar4->borders + lVar6) == 0) {
        if ((pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value.super___atomic_base<int>._M_i != 1) {
          QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_00);
          pQVar4 = (this_00->d).ptr;
        }
        *(int *)((long)pQVar4->borders + lVar6) = nativeWidth;
      }
LAB_003549a8:
      if ((pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i != 1) {
        QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_00);
        pQVar4 = (this_00->d).ptr;
      }
      if (*(int *)(*(long *)((long)pQVar4->borders + lVar6 * 2 + 0x14) + 4) == 0) {
        if ((pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value.super___atomic_base<int>._M_i != 1) {
          QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_00);
          pQVar4 = (this_00->d).ptr;
        }
        QBrush::operator=((QBrush *)((long)pQVar4->borders + lVar9 + -4),(QBrush *)&local_40);
      }
    }
    else {
      if (iVar1 != 1) goto LAB_003549a8;
      QBrush::QBrush((QBrush *)&local_48);
      pQVar4 = (this_00->d).ptr;
      if ((__int_type)
          (pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1) {
        QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_00);
        pQVar4 = (this_00->d).ptr;
      }
      uVar2 = *(undefined8 *)((long)pQVar4->borders + lVar6 * 2 + 0x14);
      *(undefined8 *)((long)pQVar4->borders + lVar6 * 2 + 0x14) = local_48;
      local_48 = uVar2;
      QBrush::~QBrush((QBrush *)&local_48);
      pQVar4 = (this_00->d).ptr;
      if ((__int_type)
          (pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1) {
        QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_00);
        pQVar4 = (this_00->d).ptr;
      }
      *(undefined4 *)((long)pQVar4->borders + lVar6) = 0;
    }
    lVar6 = lVar6 + 4;
    lVar9 = lVar9 + 8;
  } while (lVar6 != 0x10);
  QBrush::~QBrush((QBrush *)&local_40);
LAB_00354a53:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRenderRule::fixupBorder(int nativeWidth)
{
    if (bd == nullptr)
        return;

    if (!bd->hasBorderImage() || bd->bi->pixmap.isNull()) {
        bd->bi = nullptr;
        // ignore the color, border of edges that have none border-style
        QBrush color = pal ? pal->foreground : QBrush();
        const bool hasRadius = bd->radii[0].isValid() || bd->radii[1].isValid()
                               || bd->radii[2].isValid() || bd->radii[3].isValid();
        for (int i = 0; i < 4; i++) {
            if ((bd->styles[i] == BorderStyle_Native) && hasRadius)
                bd->styles[i] = BorderStyle_None;

            switch (bd->styles[i]) {
            case BorderStyle_None:
                // border-style: none forces width to be 0
                bd->colors[i] = QBrush();
                bd->borders[i] = 0;
                break;
            case BorderStyle_Native:
                if (bd->borders[i] == 0)
                    bd->borders[i] = nativeWidth;
                Q_FALLTHROUGH();
            default:
                if (bd->colors[i].style() == Qt::NoBrush) // auto-acquire 'color'
                    bd->colors[i] = color;
                break;
            }
        }

        return;
    }

    // inspect the border image
    QStyleSheetBorderImageData *bi = bd->bi;
    if (bi->cuts[0] == -1) {
        for (int i = 0; i < 4; i++) // assume, cut = border
            bi->cuts[i] = int(border()->borders[i]);
    }
}